

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.hpp
# Opt level: O2

void __thiscall
boost::deflate::detail::deflate_stream::send_bits(deflate_stream *this,int value,int length)

{
  int iVar1;
  ushort w;
  
  iVar1 = this->bi_valid_;
  if (0x10 - length < iVar1) {
    w = (ushort)(value << ((byte)iVar1 & 0x1f)) | this->bi_buf_;
    this->bi_buf_ = w;
    put_short(this,w);
    this->bi_buf_ = (uint16_t)((value & 0xffffU) >> (0x10U - (char)this->bi_valid_ & 0x1f));
    iVar1 = length + this->bi_valid_ + -0x10;
  }
  else {
    this->bi_buf_ = this->bi_buf_ | (ushort)(value << ((byte)iVar1 & 0x1f));
    iVar1 = length + iVar1;
  }
  this->bi_valid_ = iVar1;
  return;
}

Assistant:

void
    send_bits(int value, int length)
    {
        if(bi_valid_ > (int)buf_size - length)
        {
            bi_buf_ |= (std::uint16_t)value << bi_valid_;
            put_short(bi_buf_);
            bi_buf_ = (std::uint16_t)value >> (buf_size - bi_valid_);
            bi_valid_ += length - buf_size;
        }
        else
        {
            bi_buf_ |= (std::uint16_t)(value) << bi_valid_;
            bi_valid_ += length;
        }
    }